

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO1Tria<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO1Tria<double> *this,
          MatrixXd *refcoords)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  Index IVar1;
  Type local_4b0;
  RowXpr local_478;
  ConstRowXpr local_440;
  ConstRowXpr local_408;
  ConstantReturnType local_3d0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_3b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_358;
  Index local_2b0;
  int local_2a8;
  undefined1 local_2a1;
  undefined4 local_2a0;
  allocator<char> local_299;
  size_type n_pts;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *refcoords_local;
  FeLagrangeO1Tria<double> *this_local;
  Matrix<double,__1,__1,_0,__1,__1> *result;
  
  local_20 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)refcoords;
  refcoords_local = (MatrixXd *)this;
  this_local = (FeLagrangeO1Tria<double> *)__return_storage_ptr__;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar1 == 2) {
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
    local_2a0 = (undefined4)IVar1;
    local_2a1 = 0;
    local_2a8 = 3;
    local_2b0 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>
              ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_2a8,&local_2b0);
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::Ones(&local_3d0,IVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_408,local_20,0);
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>>>
    ::operator-(&local_3b8,
                (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>>
                 *)&local_3d0,
                (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                 *)&local_408);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_440,local_20,1);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>>
    ::operator-(&local_358,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>>
                 *)&local_3b8,
                (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                 *)&local_440);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_478,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_478,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                *)&local_358);
    other = local_20;
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,long>
              (&local_4b0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,1
               ,0,2,IVar1);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_4b0,other);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"Reference coordinates must be 2-vectors");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"refcoords.rows() == 2",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0x6a,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&n_pts,"",&local_299);
  lf::base::AssertionFailed(&local_248,&local_270,0x6a,(string *)&n_pts);
  std::__cxx11::string::~string((string *)&n_pts);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");
    const size_type n_pts(refcoords.cols());
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(
        3, refcoords.cols());
    result.row(0) = Eigen::RowVectorXd::Ones(refcoords.cols()) -
                    refcoords.row(0) - refcoords.row(1);
    result.block(1, 0, 2, refcoords.cols()) = refcoords;
    return result;
  }